

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

void __thiscall CSubNet::CSubNet(CSubNet *this,CNetAddr *addr,uint8_t mask)

{
  Network NVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  uint32_t uVar5;
  long lVar6;
  CSubNet *pCVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  long in_FS_OFFSET;
  bool bVar11;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::CNetAddr(&this->network);
  this->valid = false;
  this->netmask[0] = '\0';
  this->netmask[1] = '\0';
  this->netmask[2] = '\0';
  this->netmask[3] = '\0';
  this->netmask[4] = '\0';
  this->netmask[5] = '\0';
  this->netmask[6] = '\0';
  this->netmask[7] = '\0';
  this->netmask[8] = '\0';
  this->netmask[9] = '\0';
  this->netmask[10] = '\0';
  this->netmask[0xb] = '\0';
  this->netmask[0xc] = '\0';
  this->netmask[0xd] = '\0';
  this->netmask[0xe] = '\0';
  this->netmask[0xf] = '\0';
  NVar1 = addr->m_net;
  if (mask < 0x21 && NVar1 == NET_IPV4) {
    this->valid = true;
  }
  else {
    this->valid = mask < 0x81 && NVar1 == NET_IPV6;
    if (mask >= 0x81 || NVar1 != NET_IPV6) goto LAB_00d70408;
  }
  if (0x80 < mask) {
    __assert_fail("mask <= sizeof(netmask) * 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                  ,0x3a2,"CSubNet::CSubNet(const CNetAddr &, uint8_t)");
  }
  prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)this,&addr->m_addr);
  uVar5 = addr->m_scope_id;
  (this->network).m_net = addr->m_net;
  (this->network).m_scope_id = uVar5;
  uVar2 = (this->network).m_addr._size;
  bVar11 = uVar2 < 0x11;
  uVar4 = uVar2 - 0x11;
  if (bVar11) {
    uVar4 = uVar2;
  }
  if (uVar4 != 0) {
    lVar6 = 0;
    uVar8 = 0;
    do {
      bVar9 = mask;
      if (7 < mask) {
        bVar9 = 8;
      }
      bVar10 = (byte)(0xff << (8 - bVar9 & 0x1f));
      this->netmask[uVar8] = bVar10;
      pCVar7 = this;
      if (!bVar11) {
        pCVar7 = (CSubNet *)(this->network).m_addr._union.indirect_contents.indirect;
      }
      pCVar7->netmask[(lVar6 >> 0x20) + -0x20] = pCVar7->netmask[(lVar6 >> 0x20) + -0x20] & bVar10;
      mask = mask - bVar9;
      uVar8 = uVar8 + 1;
      uVar2 = (this->network).m_addr._size;
      bVar11 = uVar2 < 0x11;
      uVar4 = uVar2 - 0x11;
      if (bVar11) {
        uVar4 = uVar2;
      }
      lVar6 = lVar6 + 0x100000000;
    } while (uVar8 < uVar4);
  }
LAB_00d70408:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CSubNet::CSubNet(const CNetAddr& addr, uint8_t mask) : CSubNet()
{
    valid = (addr.IsIPv4() && mask <= ADDR_IPV4_SIZE * 8) ||
            (addr.IsIPv6() && mask <= ADDR_IPV6_SIZE * 8);
    if (!valid) {
        return;
    }

    assert(mask <= sizeof(netmask) * 8);

    network = addr;

    uint8_t n = mask;
    for (size_t i = 0; i < network.m_addr.size(); ++i) {
        const uint8_t bits = n < 8 ? n : 8;
        netmask[i] = (uint8_t)((uint8_t)0xFF << (8 - bits)); // Set first bits.
        network.m_addr[i] &= netmask[i]; // Normalize network according to netmask.
        n -= bits;
    }
}